

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void regularizer_to_weight<sparse_parameters>(vw *param_1,bfgs *b,sparse_parameters *weights)

{
  float fVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  float *pfVar5;
  int __c;
  sparse_parameters *in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  iterator iVar6;
  uint64_t i;
  iterator w;
  sparse_iterator<float> *in_stack_ffffffffffffff88;
  sparse_parameters *in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_48;
  uint32_t local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_38;
  uint32_t local_30;
  sparse_iterator<float> local_28;
  sparse_parameters *local_18;
  long local_10;
  
  if (*(long *)(in_RSI + 0xd8) != 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    iVar6 = sparse_parameters::begin(in_stack_ffffffffffffff90);
    local_38._M_cur =
         (__node_type *)
         iVar6._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_30 = iVar6._stride;
    local_28._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_38._M_cur;
    local_28._stride = local_30;
    while( true ) {
      iVar6 = sparse_parameters::end(in_stack_ffffffffffffff90);
      local_48._M_cur =
           (__node_type *)
           iVar6._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_40 = iVar6._stride;
      __s = &local_48;
      bVar2 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88);
      if (!bVar2) break;
      in_stack_ffffffffffffff90 =
           (sparse_parameters *)sparse_iterator<float>::index(&local_28,(char *)__s,__c);
      uVar3 = sparse_parameters::stride_shift(local_18);
      uVar4 = (ulong)in_stack_ffffffffffffff90 >> ((byte)uVar3 & 0x3f);
      fVar1 = *(float *)(*(long *)(local_10 + 0xd8) + uVar4 * 8);
      pfVar5 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x27fe7b);
      pfVar5[3] = fVar1;
      fVar1 = *(float *)(*(long *)(local_10 + 0xd8) + 4 + uVar4 * 8);
      pfVar5 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x27feb0);
      *pfVar5 = fVar1;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

void regularizer_to_weight(vw& /* all */, bfgs& b, T& weights)
{
  if (b.regularizers != nullptr)
  {
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      (&(*w))[W_COND] = b.regularizers[2 * i];
      *w = b.regularizers[2 * i + 1];
    }
  }
}